

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O0

Expression * __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
::createNextChild(UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
                  *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  Expression *pEVar1;
  ValueRangeAccess local_50;
  VariableType *local_38;
  Scalar *local_30;
  Scalar *local_28;
  GeneratorState *local_20;
  GeneratorState *state_local;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
  *this_local;
  
  if (this->m_child == (Expression *)0x0) {
    local_20 = state;
    state_local = (GeneratorState *)this;
    ValueRange::asAccess(&local_50,&this->m_inValueRange);
    local_38 = local_50.super_ConstValueRangeAccess.m_type;
    local_30 = local_50.super_ConstValueRangeAccess.m_min;
    local_28 = local_50.super_ConstValueRangeAccess.m_max;
    valueRange.m_min = local_50.super_ConstValueRangeAccess.m_min;
    valueRange.m_type = local_50.super_ConstValueRangeAccess.m_type;
    valueRange.m_max = local_50.super_ConstValueRangeAccess.m_max;
    pEVar1 = Expression::createRandom(state,valueRange);
    this->m_child = pEVar1;
    this_local = (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
                  *)this->m_child;
  }
  else {
    this_local = (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::AsinOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::AsinOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::AsinOp>_>
                  *)0x0;
  }
  return &this_local->super_Expression;
}

Assistant:

Expression* UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::createNextChild (GeneratorState& state)
{
	if (m_child)
		return DE_NULL;

	m_child = Expression::createRandom(state, m_inValueRange.asAccess());
	return m_child;
}